

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_serial_unix.cxx
# Opt level: O0

int ndiSerialOpen(char *device)

{
  int iVar1;
  int local_5c;
  undefined1 local_58 [4];
  int i;
  termios t;
  int serial_port;
  char *device_local;
  
  unique0x10000187 = device;
  t.c_ispeed = open(device,0x902);
  if (t.c_ispeed == 0xffffffff) {
    device_local._4_4_ = 0xffffffff;
  }
  else {
    fcntl(t.c_ispeed,4,0);
    iVar1 = fcntl(t.c_ispeed,6,&ndiSerialOpen::fl);
    if (iVar1 == 0) {
      iVar1 = tcgetattr(t.c_ispeed,(termios *)local_58);
      if (iVar1 == -1) {
        fcntl(t.c_ispeed,6,&ndiSerialOpen::fu);
        close(t.c_ispeed);
        device_local._4_4_ = 0xffffffff;
      }
      else {
        for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
          if ((ndi_open_handles[local_5c] == t.c_ispeed) || (ndi_open_handles[local_5c] == -1)) {
            ndi_open_handles[local_5c] = t.c_ispeed;
            tcgetattr(t.c_ispeed,(termios *)(ndi_save_termios + local_5c));
            break;
          }
        }
        t.c_oflag = 0;
        local_58 = (undefined1  [4])0x0;
        i = 0;
        t.c_lflag._3_1_ = 0;
        t.c_lflag._2_1_ = 0x32;
        iVar1 = tcsetattr(t.c_ispeed,0,(termios *)local_58);
        if (iVar1 == -1) {
          if (local_5c < 4) {
            ndi_open_handles[local_5c] = -1;
          }
          fcntl(t.c_ispeed,6,&ndiSerialOpen::fu);
          close(t.c_ispeed);
          device_local._4_4_ = 0xffffffff;
        }
        else {
          tcflush(t.c_ispeed,2);
          device_local._4_4_ = t.c_ispeed;
        }
      }
    }
    else {
      close(t.c_ispeed);
      device_local._4_4_ = 0xffffffff;
    }
  }
  return device_local._4_4_;
}

Assistant:

ndicapiExport int ndiSerialOpen(const char* device)
{
  static struct flock fl = { F_WRLCK, 0, 0, 0 }; /* for file locking */
  static struct flock fu = { F_UNLCK, 0, 0, 0 }; /* for file unlocking */
  int serial_port;
  struct termios t;
  int i;

  /* port is readable/writable and is (for now) non-blocking */
  serial_port = open(device, O_RDWR | O_NOCTTY | O_NDELAY);

  if (serial_port == -1)
  {
    return -1;             /* bail out on error */
  }

  /* restore blocking now that the port is open (we just didn't want */
  /* the port to block while we were trying to open it) */
  fcntl(serial_port, F_SETFL, 0);

  /* get exclusive lock on the serial port */
  /* on many unices, this has no effect for device files */
  if (fcntl(serial_port, F_SETLK, &fl))
  {
    close(serial_port);
    return -1;
  }

  /* get I/O information */
  if (tcgetattr(serial_port, &t) == -1)
  {
    fcntl(serial_port, F_SETLK, &fu);
    close(serial_port);
    return -1;
  }

  /* save the serial port state so that it can be restored when
     the serial port is closed in ndiSerialClose() */
  for (i = 0; i < NDI_MAX_SAVE_STATE; i++)
  {
    if (ndi_open_handles[i] == serial_port || ndi_open_handles[i] == -1)
    {
      ndi_open_handles[i] = serial_port;
      tcgetattr(serial_port, &ndi_save_termios[i]);
      break;
    }
  }

  /* clear everything specific to terminals */
  t.c_lflag = 0;
  t.c_iflag = 0;
  t.c_oflag = 0;

  t.c_cc[VMIN] = 0;                    /* use constant, not interval timeout */
  t.c_cc[VTIME] = TIMEOUT_PERIOD / 100; /* wait for 5 secs max */

  if (tcsetattr(serial_port, TCSANOW, &t) == -1) /* set I/O information */
  {
    if (i < NDI_MAX_SAVE_STATE)   /* if we saved the state, forget the state */
    {
      ndi_open_handles[i] = -1;
    }
    fcntl(serial_port, F_SETLK, &fu);
    close(serial_port);
    return -1;
  }

  tcflush(serial_port, TCIOFLUSH);        /* flush the buffers for good luck */

  return serial_port;
}